

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void test_keyscase::test_method<picnic_params_t_const&>(anon_enum_32 *parameters)

{
  undefined1 auVar1 [64];
  bool bVar2;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  undefined1 auVar3 [64];
  test_keyscase t;
  context_frame context_frame_320;
  lazy_ostream *in_stack_fffffffffffff568;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff570;
  std_string *in_stack_fffffffffffff578;
  basic_cstring<const_char> *in_stack_fffffffffffff580;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff590;
  basic_wrap_stringstream<char> *this_01;
  const_string *in_stack_fffffffffffff5a8;
  size_t in_stack_fffffffffffff5b0;
  const_string *in_stack_fffffffffffff5b8;
  unit_test_log_t *in_stack_fffffffffffff5c0;
  basic_wrap_stringstream<char> *this_02;
  undefined1 local_988 [64];
  undefined1 local_948 [64];
  undefined1 local_908 [64];
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 auStack_848 [24];
  undefined1 local_830 [40];
  undefined1 auStack_808 [24];
  basic_cstring<const_char> local_7e0;
  undefined1 local_7c9;
  undefined1 local_7c8 [64];
  undefined1 local_788 [64];
  undefined1 local_748 [64];
  undefined1 local_708 [64];
  undefined1 local_6c8 [64];
  undefined1 auStack_688 [24];
  undefined1 local_670 [40];
  undefined1 auStack_648 [24];
  basic_cstring<const_char> local_620;
  undefined1 local_609;
  undefined1 local_608 [64];
  undefined1 local_5c8 [64];
  undefined1 local_588 [64];
  undefined1 auVar4 [16];
  basic_cstring<const_char> local_460;
  undefined1 local_449;
  undefined1 local_448 [64];
  undefined1 local_408 [64];
  undefined1 local_3c8 [64];
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 auStack_308 [24];
  undefined1 local_2f0 [40];
  undefined1 auStack_2c8 [24];
  basic_cstring<const_char> local_2a0;
  undefined1 local_289;
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [64];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 auStack_148 [24];
  undefined1 local_130 [40];
  undefined1 auStack_108 [24];
  basic_cstring<const_char> local_d8;
  anon_enum_32 *local_c8;
  context_frame local_c [3];
  
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff578,(char (*) [1])in_stack_fffffffffffff570);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
             in_stack_fffffffffffff578,(char (*) [11])in_stack_fffffffffffff570);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)in_stack_fffffffffffff578,(char (*) [4])in_stack_fffffffffffff570);
  local_c8 = (anon_enum_32 *)
             boost::test_tools::tt_detail::print_helper<picnic_params_t>
                       ((anon_enum_32 *)in_stack_fffffffffffff568);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)in_stack_fffffffffffff578,
             (print_helper_t<picnic_params_t> *)in_stack_fffffffffffff570);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)in_stack_fffffffffffff578,(char (*) [3])in_stack_fffffffffffff570);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
              *)0x1c7027);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)0x1c7034);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>,_char[4],_const_char_(&)[4]>
              *)0x1c7041);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[11],_const_char_(&)[11]>
              *)0x1c704e);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                      *)0x1c705b);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(local_c);
  if (bVar2) {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_108 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_148 = auVar1._0_24_;
    local_130 = auVar1._24_40_;
    local_188 = vmovdqu64_avx512f(auVar3);
    local_1c8 = vmovdqu64_avx512f(auVar3);
    local_208 = vmovdqu64_avx512f(auVar3);
    local_248 = vmovdqu64_avx512f(auVar3);
    local_288 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_288);
    local_289 = 0x22;
    boost::operator<<(in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [10])in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [15])in_stack_fffffffffffff568);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
               in_stack_fffffffffffff5a8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_2c8 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_308 = auVar1._0_24_;
    local_2f0 = auVar1._24_40_;
    local_348 = vmovdqu64_avx512f(auVar3);
    local_388 = vmovdqu64_avx512f(auVar3);
    local_3c8 = vmovdqu64_avx512f(auVar3);
    local_408 = vmovdqu64_avx512f(auVar3);
    local_448 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_448);
    local_449 = 0x22;
    boost::operator<<(in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [10])in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [16])in_stack_fffffffffffff568);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
               in_stack_fffffffffffff5a8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::unit_test::setup_conditional<test_keyscase>((test_keyscase *)in_stack_fffffffffffff570);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar3);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auVar4 = auVar1._16_16_;
    local_588 = vmovdqu64_avx512f(auVar3);
    local_5c8 = vmovdqu64_avx512f(auVar3);
    local_608 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_608);
    local_609 = 0x22;
    boost::operator<<(in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [10])in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [13])in_stack_fffffffffffff568);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
               in_stack_fffffffffffff5a8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff570);
    _impl<picnic_params_t>(auVar4._8_8_,auVar4._0_8_);
    this_02 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_648 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_688 = auVar1._0_24_;
    local_670 = auVar1._24_40_;
    local_6c8 = vmovdqu64_avx512f(auVar3);
    local_708 = vmovdqu64_avx512f(auVar3);
    local_748 = vmovdqu64_avx512f(auVar3);
    local_788 = vmovdqu64_avx512f(auVar3);
    local_7c8 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff570);
    file = boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_7c8);
    local_7c9 = 0x22;
    line_num = boost::operator<<(in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    msg = boost::operator<<(in_stack_fffffffffffff570,(char (*) [10])in_stack_fffffffffffff568);
    boost::operator<<(in_stack_fffffffffffff570,(char (*) [19])in_stack_fffffffffffff568);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_02,(const_string *)file,(size_t)line_num,(const_string *)msg)
    ;
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::unit_test::teardown_conditional<test_keyscase>
              ((test_keyscase *)in_stack_fffffffffffff570);
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
               ,0x5e);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_808 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_848 = auVar1._0_24_;
    local_830 = auVar1._24_40_;
    local_888 = vmovdqu64_avx512f(auVar3);
    local_8c8 = vmovdqu64_avx512f(auVar3);
    local_908 = vmovdqu64_avx512f(auVar3);
    local_948 = vmovdqu64_avx512f(auVar3);
    local_988 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff570);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_988);
    this = boost::operator<<(in_stack_fffffffffffff570,(char *)in_stack_fffffffffffff568);
    s = boost::operator<<(in_stack_fffffffffffff570,(char (*) [10])in_stack_fffffffffffff568);
    this_00 = boost::operator<<(in_stack_fffffffffffff570,(char (*) [15])in_stack_fffffffffffff568);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)this,(std_string *)s);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_02,(const_string *)file,(size_t)line_num,(const_string *)msg)
    ;
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1c78e4);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(test_keys, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    size_t diff            = 0;
    size_t lowmc_blocksize = 0;
    switch (parameters) {
    case Picnic_L1_full:
    case Picnic3_L1:
      diff            = 7;
      lowmc_blocksize = LOWMC_BLOCK_SIZE_Picnic_L1_full;
      break;
    case Picnic_L5_full:
    case Picnic3_L5:
      diff            = 1;
      lowmc_blocksize = LOWMC_BLOCK_SIZE_Picnic_L5_full;
      break;
    default:
      // instances with key size properly aligned
      return;
    }

    for (size_t c = 0; c < rep; ++c) {
      picnic_publickey_t pk  = {0};
      picnic_privatekey_t sk = {0};

      BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

      // Public and private keys are serialized as follows:
      // - public key: instance || C || p
      // - secret key: instance || sk || C || p
      for (size_t i = 0; i < diff; ++i) {
        BOOST_TEST_INFO("sk bit " << (8 + lowmc_blocksize * 8 - i - 1));
        BOOST_TEST(!getBit(sk.data, 8 + lowmc_blocksize * 8 - i - 1));
      }
      for (size_t i = 0; i < diff; ++i) {
        BOOST_TEST_INFO("sk bit " << (8 + 2 * lowmc_blocksize * 8 - i - 1));
        BOOST_TEST(!getBit(sk.data, 8 + 2 * lowmc_blocksize * 8 - i - 1));
        BOOST_TEST_INFO("sk bit " << (8 + 3 * lowmc_blocksize * 8 - i - 1));
        BOOST_TEST(!getBit(sk.data, 8 + 3 * lowmc_blocksize * 8 - i - 1));
      }
    }
  }
}